

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

bool __thiscall SQClass::GetConstructor(SQClass *this,SQObjectPtr *ctor)

{
  SQObjectPtr *in_RSI;
  SQObjectPtr *in_RDI;
  bool bVar1;
  
  bVar1 = in_RDI[0x1b].super_SQObject._unVal.pTable != (SQTable *)0xffffffffffffffff;
  if (bVar1) {
    sqvector<SQClassMember>::operator[]
              ((sqvector<SQClassMember> *)&in_RDI[5].super_SQObject._unVal,
               in_RDI[0x1b].super_SQObject._unVal.nInteger);
    ::SQObjectPtr::operator=(in_RDI,in_RSI);
  }
  return bVar1;
}

Assistant:

bool GetConstructor(SQObjectPtr &ctor)
    {
        if(_constructoridx != -1) {
            ctor = _methods[_constructoridx].val;
            return true;
        }
        return false;
    }